

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

void __thiscall
TCLAP::ArgException::ArgException(ArgException *this,string *text,string *id,string *td)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__ArgException_00206280;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0x28),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 0x48),in_RCX);
  return;
}

Assistant:

ArgException( const std::string& text = "undefined exception", 
					  const std::string& id = "undefined",
					  const std::string& td = "Generic ArgException")
			: std::exception(), 
			  _errorText(text), 
			  _argId( id ), 
			  _typeDescription(td)
		{ }